

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O3

void __thiscall
wabt::interp::anon_unknown_0::FixupMap::Resolve(FixupMap *this,Istream *istream,Index index)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  const_iterator __position;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  bool bVar5;
  
  p_Var3 = (this->map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var3 != (_Base_ptr)0x0) {
    p_Var1 = &(this->map)._M_t._M_impl.super__Rb_tree_header;
    __position._M_node = &p_Var1->_M_header;
    do {
      bVar5 = p_Var3[1]._M_color < index;
      if (!bVar5) {
        __position._M_node = p_Var3;
      }
      p_Var3 = (&p_Var3->_M_left)[bVar5];
    } while (p_Var3 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)__position._M_node != p_Var1) &&
       (__position._M_node[1]._M_color <= index)) {
      p_Var2 = __position._M_node[1]._M_left;
      for (p_Var4 = __position._M_node[1]._M_parent; p_Var4 != p_Var2;
          p_Var4 = (_Base_ptr)&p_Var4->field_0x4) {
        Istream::ResolveFixupU32(istream,p_Var4->_M_color);
      }
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
      ::_M_erase_aux((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                      *)this,__position);
      return;
    }
  }
  return;
}

Assistant:

Result BinaryReaderInterp::OnElemSegmentElemExpr_RefNull(Index segment_index,
                                                         Type type) {
  CHECK_RESULT(validator_.OnElemSegmentElemExpr_RefNull(loc, type));
  ElemDesc& elem = module_.elems.back();
  elem.elements.push_back(ElemExpr{ElemKind::RefNull, 0});
  return Result::Ok;
}